

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

bool tchecker::is_initial(clockval_t *clockval)

{
  uint uVar1;
  type_conflict1 tVar2;
  capacity_t_conflict cVar3;
  rational<long> *a;
  int local_20;
  uint local_1c;
  make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t> *pmStack_18;
  clock_id_t id;
  clockval_t *clockval_local;
  
  local_1c = 0;
  pmStack_18 = &clockval->super_clock_value_array_t;
  while( true ) {
    uVar1 = local_1c;
    cVar3 = clockval_t::size((clockval_t *)pmStack_18);
    if (cVar3 <= uVar1) {
      return true;
    }
    a = make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t>::operator[]
                  (pmStack_18,(capacity_t_conflict)local_1c);
    local_20 = 0;
    tVar2 = boost::operator!=(a,&local_20);
    if (tVar2) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool is_initial(tchecker::clockval_t const & clockval)
{
  for (tchecker::clock_id_t id = 0; id < clockval.size(); ++id)
    if (clockval[id] != 0)
      return false;
  return true;
}